

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartSat.c
# Opt level: O0

void Aig_ManPartSplitOne_rec(Aig_Man_t *pNew,Aig_Man_t *p,Aig_Obj_t *pObj,Vec_Int_t *vPio2Id)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *p1;
  Vec_Int_t *vPio2Id_local;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  Aig_Man_t *pNew_local;
  
  iVar1 = Aig_ObjIsTravIdCurrent(p,pObj);
  if (iVar1 == 0) {
    Aig_ObjSetTravIdCurrent(p,pObj);
    pAVar2 = Aig_ObjCreateCi(pNew);
    (pObj->field_5).pData = pAVar2;
    if ((*(ulong *)&pObj->field_0x18 >> 4 & 1) == 0) {
      if ((*(ulong *)&pObj->field_0x18 >> 5 & 1) != 0) {
        *(ulong *)((long)(pObj->field_5).pData + 0x18) =
             *(ulong *)((long)(pObj->field_5).pData + 0x18) & 0xffffffffffffffdf | 0x20;
      }
    }
    else {
      *(ulong *)((long)(pObj->field_5).pData + 0x18) =
           *(ulong *)((long)(pObj->field_5).pData + 0x18) & 0xffffffffffffffef | 0x10;
    }
    iVar1 = Aig_ObjId(pObj);
    Vec_IntPush(vPio2Id,iVar1);
  }
  else if ((pObj->field_5).pData == (void *)0x0) {
    pAVar2 = Aig_ObjFanin0(pObj);
    Aig_ManPartSplitOne_rec(pNew,p,pAVar2,vPio2Id);
    pAVar2 = Aig_ObjFanin1(pObj);
    Aig_ManPartSplitOne_rec(pNew,p,pAVar2,vPio2Id);
    pAVar2 = Aig_ObjChild0Copy(pObj);
    p1 = Aig_ObjChild1Copy(pObj);
    pAVar2 = Aig_And(pNew,pAVar2,p1);
    (pObj->field_5).pData = pAVar2;
  }
  return;
}

Assistant:

void Aig_ManPartSplitOne_rec( Aig_Man_t * pNew, Aig_Man_t * p, Aig_Obj_t * pObj, Vec_Int_t * vPio2Id )
{
    if ( !Aig_ObjIsTravIdCurrent( p, pObj ) )
    { // new PI
        Aig_ObjSetTravIdCurrent( p, pObj );
/*
        if ( pObj->fMarkA ) // const0
            pObj->pData = Aig_ManConst0( pNew );
        else if ( pObj->fMarkB ) // const1
            pObj->pData = Aig_ManConst1( pNew );
        else
*/
        {
            pObj->pData = Aig_ObjCreateCi( pNew );
            if ( pObj->fMarkA ) // const0
                ((Aig_Obj_t *)pObj->pData)->fMarkA = 1;
            else if ( pObj->fMarkB ) // const1
                ((Aig_Obj_t *)pObj->pData)->fMarkB = 1;
            Vec_IntPush( vPio2Id, Aig_ObjId(pObj) );
        }
        return;
    }
    if ( pObj->pData ) 
        return;
    Aig_ManPartSplitOne_rec( pNew, p, Aig_ObjFanin0(pObj), vPio2Id );
    Aig_ManPartSplitOne_rec( pNew, p, Aig_ObjFanin1(pObj), vPio2Id );
    pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
}